

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

ParseableFunctionInfo *
Js::ParseableFunctionInfo::NewDeferredFunctionFromFunctionBody(FunctionBody *functionBody)

{
  NestedArray *pNVar1;
  Recycler *pRVar2;
  ParseableFunctionInfo *this;
  ProxyEntryPointInfo *this_00;
  FunctionInfoPtrPtr pTVar3;
  undefined8 uVar4;
  Type TVar5;
  uint index;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  data._32_8_ = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext;
  pNVar1 = (functionBody->super_ParseableFunctionInfo).nestedArray.ptr;
  if (pNVar1 == (NestedArray *)0x0) {
    TVar5 = 0;
  }
  else {
    TVar5 = pNVar1->nestedCount;
  }
  local_60 = (undefined1  [8])&typeinfo;
  index = 0;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab601b;
  data.filename._0_4_ = 0x6fe;
  pRVar2 = Memory::Recycler::TrackAllocInfo
                     (((Type)data._32_8_)->recycler,(TrackAllocData *)local_60);
  this = (ParseableFunctionInfo *)new<Memory::Recycler>(0xb8,pRVar2,0x78130e);
  ParseableFunctionInfo(this,&functionBody->super_ParseableFunctionInfo);
  local_60 = (undefined1  [8])&ProxyEntryPointInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab601b;
  data.filename._0_4_ = 0x701;
  pRVar2 = Memory::Recycler::TrackAllocInfo
                     (*(Recycler **)(data._32_8_ + 0x1200),(TrackAllocData *)local_60);
  uVar4 = 0;
  this_00 = (ProxyEntryPointInfo *)new<Memory::Recycler>(0x18,pRVar2,0x38bbb2);
  data._32_8_ = *(undefined8 *)(data._32_8_ + 0x88);
  ExpirableObject::ExpirableObject((ExpirableObject *)this_00,(ThreadContext *)0x0);
  (this_00->super_ExpirableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014eff80;
  this_00->jsMethod = (Type)data._32_8_;
  data._32_8_ = &(this->super_FunctionProxy).m_defaultEntryPointInfo;
  Memory::Recycler::WBSetBit((char *)data._32_8_);
  (this->super_FunctionProxy).m_defaultEntryPointInfo.ptr = this_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((void *)data._32_8_);
  if (TVar5 != 0) {
    do {
      pTVar3 = GetNestedFuncReference(&functionBody->super_ParseableFunctionInfo,index);
      SetNestedFunc(this,pTVar3->ptr,index,(uint32)uVar4);
      index = index + 1;
    } while (TVar5 != index);
  }
  return this;
}

Assistant:

ParseableFunctionInfo *
    ParseableFunctionInfo::NewDeferredFunctionFromFunctionBody(FunctionBody * functionBody)
    {
        ScriptContext * scriptContext = functionBody->GetScriptContext();
        uint nestedCount = functionBody->GetNestedCount();

        ParseableFunctionInfo * info = RecyclerNewWithBarrierFinalized(scriptContext->GetRecycler(),
            ParseableFunctionInfo,
            functionBody);

        // Create new entry point info
        info->m_defaultEntryPointInfo = RecyclerNew(scriptContext->GetRecycler(), ProxyEntryPointInfo, scriptContext->DeferredParsingThunk);

        // Initialize nested function array, update back pointers
        for (uint i = 0; i < nestedCount; i++)
        {
            FunctionInfo * nestedInfo = functionBody->GetNestedFunc(i);
            info->SetNestedFunc(nestedInfo, i, 0);
        }

        // Update function objects

        return info;
    }